

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarQueueReorderFromMousePos
               (ImGuiTabBar *tab_bar,ImGuiTabItem *src_tab,ImVec2 mouse_pos)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  int iVar4;
  ImGuiTabItem *pIVar5;
  ImGuiTabItem *in_RSI;
  ImGuiTabBar *in_RDI;
  float in_XMM0_Da;
  float x2;
  float x1;
  ImGuiTabItem *dst_tab;
  int i;
  int dst_idx;
  int src_idx;
  int dir;
  float bar_offset;
  bool is_central_section;
  ImGuiContext *g;
  float local_50;
  int local_38;
  int local_34;
  
  pIVar2 = GImGui;
  if ((in_RDI->Flags & 1U) != 0) {
    if ((in_RSI->Flags & 0xc0U) == 0) {
      local_50 = in_RDI->ScrollingTarget;
    }
    else {
      local_50 = 0.0;
    }
    local_50 = (in_RDI->BarRect).Min.x - local_50;
    iVar3 = 1;
    if (in_XMM0_Da < local_50 + in_RSI->Offset) {
      iVar3 = -1;
    }
    iVar4 = ImVector<ImGuiTabItem>::index_from_ptr(&in_RDI->Tabs,in_RSI);
    local_38 = iVar4;
    local_34 = iVar4;
    while( true ) {
      bVar1 = false;
      if (-1 < local_38) {
        bVar1 = local_38 < (in_RDI->Tabs).Size;
      }
      if (((!bVar1) ||
          (pIVar5 = ImVector<ImGuiTabItem>::operator[](&in_RDI->Tabs,local_38),
          (pIVar5->Flags & 0x20U) != 0)) || ((pIVar5->Flags & 0xc0U) != (in_RSI->Flags & 0xc0U)))
      break;
      local_34 = local_38;
      if (((iVar3 < 0) &&
          ((local_50 + pIVar5->Offset) - (pIVar2->Style).ItemInnerSpacing.x < in_XMM0_Da)) ||
         ((0 < iVar3 &&
          (in_XMM0_Da <
           local_50 + pIVar5->Offset + pIVar5->Width + (pIVar2->Style).ItemInnerSpacing.x)))) break;
      local_38 = iVar3 + local_38;
    }
    if (local_34 != iVar4) {
      TabBarQueueReorder(in_RDI,in_RSI,local_34 - iVar4);
    }
  }
  return;
}

Assistant:

void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar* tab_bar, const ImGuiTabItem* src_tab, ImVec2 mouse_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    if ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) == 0)
        return;

    const bool is_central_section = (src_tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    const float bar_offset = tab_bar->BarRect.Min.x - (is_central_section ? tab_bar->ScrollingTarget : 0);

    // Count number of contiguous tabs we are crossing over
    const int dir = (bar_offset + src_tab->Offset) > mouse_pos.x ? -1 : +1;
    const int src_idx = tab_bar->Tabs.index_from_ptr(src_tab);
    int dst_idx = src_idx;
    for (int i = src_idx; i >= 0 && i < tab_bar->Tabs.Size; i += dir)
    {
        // Reordered tabs must share the same section
        const ImGuiTabItem* dst_tab = &tab_bar->Tabs[i];
        if (dst_tab->Flags & ImGuiTabItemFlags_NoReorder)
            break;
        if ((dst_tab->Flags & ImGuiTabItemFlags_SectionMask_) != (src_tab->Flags & ImGuiTabItemFlags_SectionMask_))
            break;
        dst_idx = i;

        // Include spacing after tab, so when mouse cursor is between tabs we would not continue checking further tabs that are not hovered.
        const float x1 = bar_offset + dst_tab->Offset - g.Style.ItemInnerSpacing.x;
        const float x2 = bar_offset + dst_tab->Offset + dst_tab->Width + g.Style.ItemInnerSpacing.x;
        //GetForegroundDrawList()->AddRect(ImVec2(x1, tab_bar->BarRect.Min.y), ImVec2(x2, tab_bar->BarRect.Max.y), IM_COL32(255, 0, 0, 255));
        if ((dir < 0 && mouse_pos.x > x1) || (dir > 0 && mouse_pos.x < x2))
            break;
    }

    if (dst_idx != src_idx)
        TabBarQueueReorder(tab_bar, src_tab, dst_idx - src_idx);
}